

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Int_t * Pdr_InvMinimize(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  int *piVar12;
  sat_solver *__s;
  Vec_Int_t *p_02;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  sat_solver *psVar22;
  uint *puVar23;
  uint *puVar24;
  uint uVar25;
  timespec ts;
  long local_78;
  timespec local_58;
  Vec_Int_t *local_48;
  Cnf_Dat_t *local_40;
  uint *local_38;
  
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    local_78 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_78 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  __s = (sat_solver *)0x0;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  puVar4 = (uint *)vInv->pArray;
  uVar20 = *puVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar12 = (int *)malloc(400);
  p_01->pArray = piVar12;
  iVar8 = (((int)uVar20 >> 5) + 1) - (uint)((uVar20 & 0x1f) == 0);
  local_48 = vInv;
  if (iVar8 != 0) {
    __s = (sat_solver *)malloc((long)iVar8 * 4);
  }
  memset(__s,0,(long)iVar8 << 2);
  iVar15 = p_00->nVars;
  iVar1 = p->nRegs;
  iVar2 = p->vCos->nSize;
  iVar9 = sat_solver_nvars(s);
  iVar10 = sat_solver_nvars(s);
  local_40 = p_00;
  if (iVar10 != p_00->nVars) {
    __assert_fail("sat_solver_nvars(pSat) == pCnf->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                  ,0x333,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
  }
  iVar10 = sat_solver_nvars(s);
  psVar22 = s;
  sat_solver_setnvars(s,iVar10 + uVar20);
  puVar23 = puVar4 + 1;
  if (0 < (int)*puVar4) {
    iVar10 = 0;
    puVar24 = puVar23;
    do {
      if (iVar9 < 0) {
LAB_005e7d14:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if (p_01->nCap < 1) {
        if (p_01->pArray == (int *)0x0) {
          piVar12 = (int *)malloc(4);
        }
        else {
          piVar12 = (int *)realloc(p_01->pArray,4);
        }
        p_01->pArray = piVar12;
        if (piVar12 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p_01->nCap = 1;
      }
      *p_01->pArray = (iVar9 + iVar10) * 2 + 1;
      p_01->nSize = 1;
      if (0 < (int)*puVar24) {
        lVar16 = 0;
        do {
          uVar14 = puVar24[lVar16 + 1];
          if ((int)uVar14 < 0) {
LAB_005e7d33:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          iVar13 = (uVar14 >> 1) + (iVar15 - iVar1);
          if (iVar13 < 0) goto LAB_005e7d14;
          lVar16 = lVar16 + 1;
          Vec_IntPush(p_01,(uVar14 & 1) + iVar13 * 2 ^ 1);
        } while (lVar16 < (int)*puVar24);
      }
      psVar22 = s;
      iVar13 = sat_solver_addclause(s,p_01->pArray,p_01->pArray + p_01->nSize);
      if (iVar13 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x33e,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
      }
      iVar10 = iVar10 + 1;
      puVar24 = puVar24 + (long)(int)*puVar24 + 1;
    } while (iVar10 < (int)*puVar4);
  }
  uVar14 = iVar8 * 0x20;
  bVar5 = (int)*puVar4 < 1;
  if ((int)*puVar4 < 1) {
    uVar18 = 0;
  }
  else {
    uVar21 = 0;
    if (0 < iVar8 * 0x20) {
      uVar21 = uVar14;
    }
    uVar25 = 0;
    uVar18 = 0;
    local_38 = puVar23;
    do {
      if (uVar25 == uVar21) goto LAB_005e7d52;
      if (((uint)(__s->Mem).nEntries[(ulong)(uVar25 >> 5) - 4] >> (uVar25 & 0x1f) & 1) == 0) {
        p_01->nSize = 0;
        if (0 < (int)uVar20) {
          uVar17 = 0;
          iVar8 = iVar9 * 2;
          do {
            uVar19 = (uint)uVar17;
            if (uVar25 != uVar19) {
              if ((int)uVar14 <= (int)uVar19) goto LAB_005e7d52;
              if (((uint)(__s->Mem).nEntries[(uVar17 >> 5) - 4] >> (uVar19 & 0x1f) & 1) == 0) {
                if ((int)(iVar9 + uVar19) < 0) goto LAB_005e7d14;
                Vec_IntPush(p_01,iVar8);
                puVar23 = local_38;
              }
            }
            uVar17 = (ulong)(uVar19 + 1);
            iVar8 = iVar8 + 2;
          } while (uVar20 != uVar19 + 1);
        }
        iVar8 = p_01->nSize;
        iVar10 = 2;
        iVar15 = 0;
        do {
          iVar13 = iVar15;
          if (p->vCos->nSize - p->nRegs <= iVar13) goto LAB_005e796c;
          if (p_01->nSize < iVar8) goto LAB_005e7d90;
          p_01->nSize = iVar8;
          Vec_IntPush(p_01,iVar10);
          psVar22 = s;
          iVar11 = sat_solver_solve(s,p_01->pArray,p_01->pArray + p_01->nSize,0,0,0,0);
          iVar10 = iVar10 + 2;
          iVar15 = iVar13 + 1;
        } while (iVar11 == -1);
        if (iVar11 == 0) break;
        if (iVar11 != 1) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                        ,0x35a,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
        }
LAB_005e796c:
        if (p->vCos->nSize - p->nRegs <= iVar13) {
          bVar7 = true;
          if (0 < (int)*puVar4) {
            uVar19 = 0;
            puVar24 = puVar23;
            do {
              if (uVar19 == uVar21) goto LAB_005e7d52;
              if ((uVar19 != uVar25) &&
                 ((1 << ((byte)uVar19 & 0x1f) & (__s->Mem).nEntries[(ulong)(uVar19 >> 5) - 4]) == 0)
                 ) {
                if (p_01->nSize < iVar8) {
LAB_005e7d90:
                  __assert_fail("p->nSize >= nSizeNew",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
                }
                p_01->nSize = iVar8;
                if (0 < (int)*puVar24) {
                  lVar16 = 0;
                  do {
                    uVar3 = puVar24[lVar16 + 1];
                    if ((int)uVar3 < 0) goto LAB_005e7d33;
                    iVar15 = (uVar3 >> 1) + (iVar2 - iVar1) + 1;
                    if (iVar15 < 0) goto LAB_005e7d14;
                    lVar16 = lVar16 + 1;
                    Vec_IntPush(p_01,(uVar3 & 1) + iVar15 * 2);
                  } while (lVar16 < (int)*puVar24);
                }
                iVar15 = sat_solver_solve(s,p_01->pArray,p_01->pArray + p_01->nSize,0,0,0,0);
                if (iVar15 != -1) {
                  if (iVar15 != 0) {
                    if (iVar15 != 1) {
                      __assert_fail("status == l_True",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                                    ,0x375,
                                    "Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
                    }
                    bVar6 = false;
                    goto LAB_005e7a93;
                  }
                  bVar7 = false;
                  break;
                }
              }
              uVar19 = uVar19 + 1;
              puVar24 = puVar24 + (long)(int)*puVar24 + 1;
            } while ((int)uVar19 < (int)*puVar4);
          }
          bVar6 = true;
LAB_005e7a93:
          psVar22 = __s;
          if (!bVar7) break;
          if (bVar6) {
            if (fVerbose != 0) {
              Abc_Print((int)__s,"Removing clause %d.\n",(ulong)uVar25);
            }
            piVar12 = (__s->Mem).nEntries + ((ulong)(uVar25 >> 5) - 4);
            *piVar12 = *piVar12 | 1 << (sbyte)(uVar25 & 0x1f);
            uVar18 = uVar18 + 1;
          }
        }
      }
      uVar25 = uVar25 + 1;
      bVar5 = (int)*puVar4 <= (int)uVar25;
      psVar22 = __s;
    } while ((int)uVar25 < (int)*puVar4);
  }
  if (uVar18 == 0) {
    Abc_Print((int)psVar22,"Invariant minimization did not change the invariant.  ");
  }
  else {
    Abc_Print((int)psVar22,"Invariant minimization reduced %d clauses (out of %d).  ",(ulong)uVar18,
              (ulong)uVar20);
  }
  iVar15 = 3;
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p_02 = (Vec_Int_t *)0x0;
  Abc_Print(iVar15,"%s =","Time");
  Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar16 + local_78) / 1000000.0);
  if (!(bool)(~bVar5 & 1) && 0 < (int)uVar18) {
    p_02 = (Vec_Int_t *)malloc(0x10);
    p_02->nCap = 1000;
    p_02->nSize = 0;
    piVar12 = (int *)malloc(4000);
    p_02->pArray = piVar12;
    Vec_IntPush(p_02,uVar20 - uVar18);
    if (0 < (int)*puVar4) {
      uVar20 = 0;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      do {
        if (uVar20 == uVar14) {
LAB_005e7d52:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((((uint)(__s->Mem).nEntries[(ulong)(uVar20 >> 5) - 4] >> (uVar20 & 0x1f) & 1) == 0) &&
           (-1 < (int)*puVar23)) {
          lVar16 = -1;
          do {
            Vec_IntPush(p_02,puVar23[lVar16 + 1]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (int)*puVar23);
        }
        uVar20 = uVar20 + 1;
        puVar23 = puVar23 + (long)(int)*puVar23 + 1;
      } while ((int)uVar20 < (int)*puVar4);
    }
    if ((long)local_48->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    Vec_IntPush(p_02,local_48->pArray[(long)local_48->nSize + -1]);
  }
  Cnf_DataFree(local_40);
  sat_solver_delete(s);
  if (__s != (sat_solver *)0x0) {
    free(__s);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  return p_02;
}

Assistant:

Vec_Int_t * Pdr_InvMinimize( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    abctime clk = Abc_Clock();
    int n, i, k, status, nLits, fFailed = 0, fCannot = 0, nRemoved = 0; 
    Vec_Int_t * vRes = NULL;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    int * pCube, * pList = Vec_IntArray(vInv), nCubes = pList[0];
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    Vec_Bit_t * vRemoved = Vec_BitStart( nCubes );
    int iFoVarBeg = pCnf->nVars - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    int iAuxVarBeg = sat_solver_nvars(pSat);
    // allocate auxiliary variables
    assert( sat_solver_nvars(pSat) == pCnf->nVars );
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + nCubes );
    // add clauses
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(iAuxVarBeg + i, 1) ); // neg aux literal
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through clauses 
    Pdr_ForEachCube( pList, pCube, i )
    {
        if ( Vec_BitEntry(vRemoved, i) )
            continue;
        // collect aux literals for remaining clauses
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && !Vec_BitEntry(vRemoved, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(iAuxVarBeg + k, 0) ); // pos aux literal
        nLits = Vec_IntSize( vLits );
        // check if the property still holds
        if ( fCheckProperty )
        {
            for ( k = 0; k < Gia_ManPoNum(p); k++ )
            {
                Vec_IntShrink( vLits, nLits );
                Vec_IntPush( vLits, Abc_Var2Lit(1+k, 0) );
                status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
                if ( status == l_Undef ) // timeout
                {
                    fFailed = 1;
                    break;
                }
                if ( status == l_True ) // sat - property fails
                    break;
                assert( status == l_False ); // unsat - property holds
            }
            if ( fFailed )
                break;
            if ( k < Gia_ManPoNum(p) )
                continue;
        }
        // check other clauses
        fCannot = 0;
        Pdr_ForEachCube( pList, pCube, n )
        {
            if ( Vec_BitEntry(vRemoved, n) || n == i )
                continue;
            // collect cube
            Vec_IntShrink( vLits, nLits );
            for ( k = 0; k < pCube[0]; k++ )
               Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
            // check if this cube intersects with the complement of other cubes in the solver
            // if it does not intersect, then it is redundant and can be skipped
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
            {
                fFailed = 1;
                break;
            }
            if ( status == l_False ) // unsat -- correct
                continue;
            assert( status == l_True );
            // cannot remove
            fCannot = 1;
            break;
        }
        if ( fFailed )
            break;
        if ( fCannot )
            continue;
        if ( fVerbose )
        Abc_Print(1, "Removing clause %d.\n", i );
        Vec_BitWriteEntry( vRemoved, i, 1 );
        nRemoved++;
    }
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d clauses (out of %d).  ", nRemoved, nCubes );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // cleanup cover
    if ( !fFailed && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, nCubes-nRemoved );
        Pdr_ForEachCube( pList, pCube, i )
            if ( !Vec_BitEntry(vRemoved, i) )
                for ( k = 0; k <= pCube[0]; k++ )
                    Vec_IntPush( vRes, pCube[k] );
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_BitFree( vRemoved );
    Vec_IntFree( vLits );
    return vRes;
}